

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O3

bool __thiscall QLocalSocket::waitForConnected(QLocalSocket *this,int msec)

{
  QLocalSocketPrivate *this_00;
  QDeadlineTimer QVar1;
  QArrayData *pQVar2;
  LocalSocketState LVar3;
  int iVar4;
  long lVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QString local_80;
  undefined1 local_68 [16];
  pollfd local_58;
  QArrayData *local_50;
  char16_t *local_48;
  qsizetype qStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLocalSocketPrivate **)&this->field_0x8;
  LVar3 = state(this);
  if (LVar3 == ConnectingState) {
    local_58 = (pollfd)((ulong)(uint)this_00->connectingSocket | 0x100000000);
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QDeadlineTimer::QDeadlineTimer((QDeadlineTimer *)local_68,(long)msec,CoarseTimer);
    if ((undefined1 *)local_68._0_8_ != (undefined1 *)0x7fffffffffffffff) {
      QDeadlineTimer::rawRemainingTimeNSecs();
    }
    do {
      do {
        QVar1.t2 = local_68._8_4_;
        QVar1.type = local_68._12_4_;
        QVar1.t1 = local_68._0_8_;
        iVar4 = qt_safe_poll(&local_58,1,QVar1);
        if (iVar4 == -1) {
          QVar6.m_data = (storage_type *)0x1e;
          QVar6.m_size = (qsizetype)&local_50;
          QString::fromLatin1(QVar6);
          pQVar2 = local_50;
          local_80.d.d = (Data *)local_50;
          local_80.d.ptr = local_48;
          local_80.d.size = qStack_40;
          QLocalSocketPrivate::setErrorAndEmit(this_00,UnknownSocketError,&local_80);
          if (pQVar2 != (QArrayData *)0x0) {
            LOCK();
            (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        else if (0 < iVar4) {
          QLocalSocketPrivate::_q_connectToSocket(this_00);
        }
        LVar3 = state(this);
        if (LVar3 != ConnectingState) goto LAB_00244467;
      } while ((undefined1 *)local_68._0_8_ == (undefined1 *)0x7fffffffffffffff);
      lVar5 = QDeadlineTimer::rawRemainingTimeNSecs();
    } while (0 < lVar5);
  }
LAB_00244467:
  LVar3 = state(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return LVar3 == ConnectedState;
  }
  __stack_chk_fail();
}

Assistant:

bool QLocalSocket::waitForConnected(int msec)
{
    Q_D(QLocalSocket);

    if (state() != ConnectingState)
        return (state() == ConnectedState);

    pollfd pfd = qt_make_pollfd(d->connectingSocket, POLLIN);

    QDeadlineTimer deadline{msec};
    auto remainingTime = deadline.remainingTimeAsDuration();

    do {
        const int result = qt_safe_poll(&pfd, 1, deadline);
        if (result == -1)
            d->setErrorAndEmit(QLocalSocket::UnknownSocketError,
                               "QLocalSocket::waitForConnected"_L1);
        else if (result > 0)
            d->_q_connectToSocket();
    } while (state() == ConnectingState
             && (remainingTime = deadline.remainingTimeAsDuration()) > 0ns);

    return (state() == ConnectedState);
}